

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

char * make_ARB1_srcarg_string_in_buf(Context *ctx,SourceArgInfo *arg,char *buf,size_t buflen)

{
  uint uVar1;
  uint uVar2;
  SourceMod SVar3;
  MOJOSHADER_shaderType shader_type;
  size_t sVar4;
  bool bVar5;
  undefined4 uVar6;
  int iVar7;
  char *pcVar8;
  RegisterType rtype;
  size_t buflen_00;
  ulong *puVar9;
  char *buf_00;
  char *fmt;
  size_t in_R8;
  uint uVar10;
  long lVar11;
  char acStack_128 [56];
  code *pcStack_f0;
  char acStack_e8 [56];
  undefined8 uStack_b0;
  ulong uStack_a8;
  char rel_offset [32];
  char regnum_str [16];
  char *local_70;
  char *local_68;
  char *local_60;
  char local_56 [6];
  char *pcStack_50;
  char swizzle_str [6];
  char *local_48;
  char *local_40;
  undefined4 local_34;
  char rel_swizzle [4];
  
  puVar9 = &uStack_a8;
  rel_offset[0x18] = '\0';
  rel_offset[0x19] = '\0';
  rel_offset[0x1a] = '\0';
  rel_offset[0x1b] = '\0';
  rel_offset[0x1c] = '\0';
  rel_offset[0x1d] = '\0';
  rel_offset[0x1e] = '\0';
  rel_offset[0x1f] = '\0';
  if (arg->relative == 0) {
    uStack_b0 = 0x117fe2;
    local_60 = get_D3D_register_string(ctx,arg->regtype,arg->regnum,rel_offset + 0x18,in_R8);
    rel_offset[8] = '\0';
    rel_offset[9] = '\0';
    rel_offset[10] = '\0';
    rel_offset[0xb] = '\0';
    rel_offset[0xc] = '\0';
    rel_offset[0xd] = '\0';
    rel_offset[0xe] = '\0';
    rel_offset[0xf] = '\0';
    rel_offset[0x10] = '\0';
    rel_offset[0x11] = '\0';
    rel_offset[0x12] = '\0';
    rel_offset[0x13] = '\0';
    rel_offset[0x14] = '\0';
    rel_offset[0x15] = '\0';
    rel_offset[0x16] = '\0';
    rel_offset[0x17] = '\0';
    uStack_a8 = 0;
    rel_offset[0] = '\0';
    rel_offset[1] = '\0';
    rel_offset[2] = '\0';
    rel_offset[3] = '\0';
    rel_offset[4] = '\0';
    rel_offset[5] = '\0';
    rel_offset[6] = '\0';
    rel_offset[7] = '\0';
    local_34 = 0;
    if (arg->relative != 0) goto LAB_00118003;
    local_48 = "";
    local_70 = "";
    local_68 = "";
  }
  else {
LAB_00118003:
    local_34 = 0;
    rel_offset[0x10] = '\0';
    rel_offset[0x11] = '\0';
    rel_offset[0x12] = '\0';
    rel_offset[0x13] = '\0';
    rel_offset[0x14] = '\0';
    rel_offset[0x15] = '\0';
    rel_offset[0x16] = '\0';
    rel_offset[0x17] = '\0';
    rel_offset[8] = '\0';
    rel_offset[9] = '\0';
    rel_offset[10] = '\0';
    rel_offset[0xb] = '\0';
    rel_offset[0xc] = '\0';
    rel_offset[0xd] = '\0';
    rel_offset[0xe] = '\0';
    rel_offset[0xf] = '\0';
    rel_offset[0] = '\0';
    rel_offset[1] = '\0';
    rel_offset[2] = '\0';
    rel_offset[3] = '\0';
    rel_offset[4] = '\0';
    rel_offset[5] = '\0';
    rel_offset[6] = '\0';
    rel_offset[7] = '\0';
    uStack_a8 = 0;
    local_48 = acStack_e8;
    pcStack_f0 = (code *)0x118020;
    get_D3D_varname_in_buf(ctx,arg->relative_regtype,arg->relative_regnum,local_48,in_R8);
    uVar6 = local_34;
    local_34._0_2_ = CONCAT11("xyzw"[arg->relative_component],0x2e);
    local_34._3_1_ = SUB41(uVar6,3);
    local_34._0_3_ = (uint3)(ushort)local_34;
    if (ctx->profile_supports_nv2 == 0) {
      if (arg->relative_regtype != REG_TYPE_ADDRESS) {
        pcStack_f0 = (code *)0x118528;
        __assert_fail("arg->relative_regtype == REG_TYPE_ADDRESS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x193f,
                      "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
      if (arg->relative_regnum != 0) {
        pcStack_f0 = get_ARB1_destarg_varname;
        __assert_fail("arg->relative_regnum == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1940,
                      "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
      if (ctx->last_address_reg_component != arg->relative_component) {
        pcStack_f0 = (code *)0x11807d;
        output_line(ctx,"ARL %s.x, addr%d.%c;",local_48,0);
        ctx->last_address_reg_component = arg->relative_component;
      }
      local_34._0_2_ = CONCAT11(0x78,(undefined1)local_34);
    }
    local_68 = "[";
    local_70 = "]";
    if (arg->regtype == REG_TYPE_INPUT) {
      local_60 = "vertex.attrib";
      puVar9 = (ulong *)local_48;
    }
    else {
      if (arg->regtype != REG_TYPE_CONST) {
        pcStack_f0 = (code *)0x1184ea;
        __assert_fail("arg->regtype == REG_TYPE_CONST",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1950,
                      "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
      uVar1 = arg->relative_array->index;
      uVar2 = arg->regnum;
      uVar10 = uVar2 - uVar1;
      if ((int)uVar10 < 0) {
        pcStack_f0 = (code *)0x118509;
        __assert_fail("offset >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1954,
                      "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
      local_60 = acStack_128;
      snprintf(local_60,0x40,"c_array_%d_%d",(ulong)uVar1,(ulong)(uint)arg->relative_array->count);
      if (uVar2 != uVar1) {
        snprintf((char *)&uStack_a8,0x20," + %d",(ulong)uVar10);
      }
      local_68 = "[";
      local_70 = "]";
      puVar9 = (ulong *)local_60;
    }
  }
  *(char *)((long)puVar9 + -8) = '@';
  *(char *)((long)puVar9 + -7) = '\0';
  *(char *)((long)puVar9 + -6) = '\0';
  *(char *)((long)puVar9 + -5) = '\0';
  *(char *)((long)puVar9 + -4) = '\0';
  *(char *)((long)puVar9 + -3) = '\0';
  *(char *)((long)puVar9 + -2) = '\0';
  *(char *)((long)puVar9 + -1) = '\0';
  sVar4 = *(size_t *)((long)puVar9 + -8);
  *(char **)((long)puVar9 + -8) = local_70;
  *(ulong **)((long)puVar9 + -0x10) = &uStack_a8;
  *(undefined4 **)((long)puVar9 + -0x18) = &local_34;
  *(char **)((long)puVar9 + -0x20) = local_48;
  *(char *)((long)puVar9 + -0x28) = -0x7e;
  *(char *)((long)puVar9 + -0x27) = -0x7f;
  *(char *)((long)puVar9 + -0x26) = '\x11';
  *(char *)((long)puVar9 + -0x25) = '\0';
  *(char *)((long)puVar9 + -0x24) = '\0';
  *(char *)((long)puVar9 + -0x23) = '\0';
  *(char *)((long)puVar9 + -0x22) = '\0';
  *(char *)((long)puVar9 + -0x21) = '\0';
  snprintf(buf,sVar4,"%s%s%s%s%s%s%s",local_60,rel_offset + 0x18);
  SVar3 = arg->src_mod;
  buf_00 = (char *)puVar9;
  if (SRCMOD_NEGATE < SVar3) {
    if ((SVar3 != SRCMOD_ABS) || (ctx->profile_supports_nv2 == 0)) {
      local_48 = "";
      buf_00 = (char *)((long)puVar9 + -0x40);
      builtin_strncpy((char *)((long)puVar9 + -0x48),"ǁ\x11",4);
      *(char *)((long)puVar9 + -0x44) = '\0';
      *(char *)((long)puVar9 + -0x43) = '\0';
      *(char *)((long)puVar9 + -0x42) = '\0';
      *(char *)((long)puVar9 + -0x41) = '\0';
      allocate_ARB1_scratch_reg_name(ctx,buf_00,buflen_00);
      rel_offset._24_8_ = rel_offset._24_8_ & 0xffffffffffffff00;
      uStack_a8 = uStack_a8 & 0xffffffffffffff00;
      local_34 = local_34 & 0xffffff00;
      local_70 = "";
      local_68 = "";
      local_60 = buf_00;
      goto LAB_001181dd;
    }
    local_40 = "";
    goto switchD_00118202_caseD_b;
  }
LAB_001181dd:
  local_40 = "";
  pcVar8 = "";
  switch(SVar3) {
  case SRCMOD_NEGATE:
    pcStack_50 = "";
    local_40 = "-";
    break;
  case SRCMOD_BIASNEGATE:
    pcVar8 = "-";
  case SRCMOD_BIAS:
    fmt = "SUB %s, %s, { 0.5, 0.5, 0.5, 0.5 };";
    local_40 = pcVar8;
    goto LAB_0011831b;
  case SRCMOD_SIGNNEGATE:
    pcVar8 = "-";
  case SRCMOD_SIGN:
    fmt = "MAD %s, %s, { 2.0, 2.0, 2.0, 2.0 }, { -1.0, -1.0, -1.0, -1.0 };";
    local_40 = pcVar8;
    goto LAB_0011831b;
  case SRCMOD_COMPLEMENT:
    buf_00[-8] = 'M';
    buf_00[-7] = -0x7d;
    buf_00[-6] = '\x11';
    buf_00[-5] = '\0';
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    output_line(ctx,"SUB %s, { 1.0, 1.0, 1.0, 1.0 }, %s;",local_60,buf);
    pcStack_50 = "";
    local_40 = "";
    break;
  case SRCMOD_X2NEGATE:
    pcVar8 = "-";
  case SRCMOD_X2:
    fmt = "MUL %s, %s, { 2.0, 2.0, 2.0, 2.0 };";
    local_40 = pcVar8;
LAB_0011831b:
    pcStack_50 = "";
    buf_00[-8] = ',';
    buf_00[-7] = -0x7d;
    buf_00[-6] = '\x11';
    buf_00[-5] = '\0';
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    output_line(ctx,fmt,local_60,buf);
    break;
  case SRCMOD_DZ:
    buf_00[-8] = '{';
    buf_00[-7] = -0x7d;
    buf_00[-6] = '\x11';
    buf_00[-5] = '\0';
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    fail(ctx,"SRCMOD_DZ currently unsupported in arb1");
    local_40 = "";
    pcStack_50 = "_dz";
    break;
  case SRCMOD_DW:
    builtin_strncpy(buf_00 + -8,"Ղ\x11",4);
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    fail(ctx,"SRCMOD_DW currently unsupported in arb1");
    local_40 = "";
    pcStack_50 = "_dw";
    break;
  case SRCMOD_ABS:
    goto switchD_00118202_caseD_b;
  case SRCMOD_ABSNEGATE:
    local_40 = "-";
    goto switchD_00118202_caseD_b;
  case SRCMOD_NOT:
    pcStack_50 = "";
    buf_00[-8] = -0x51;
    buf_00[-7] = -0x7e;
    buf_00[-6] = '\x11';
    buf_00[-5] = '\0';
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    fail(ctx,"SRCMOD_NOT currently unsupported in arb1");
    local_40 = "!";
    break;
  default:
    pcStack_50 = "";
    local_40 = "";
  }
LAB_0011838a:
  rtype = arg->regtype;
  bVar5 = true;
  if (rtype == REG_TYPE_MISCTYPE && ctx->profile_supports_nv4 != 0) {
    *(undefined8 *)(buf_00 + -8) = 0x11;
    rtype = (RegisterType)*(undefined8 *)(buf_00 + -8);
    if (arg->regnum != 1) goto LAB_001183c1;
    local_56[0] = '.';
    local_56[1] = 'x';
    *(undefined8 *)(buf_00 + -8) = 2;
    lVar11 = *(long *)(buf_00 + -8);
    bVar5 = false;
  }
  else {
LAB_001183c1:
    lVar11 = 0;
  }
  shader_type = ctx->shader_type;
  iVar7 = arg->regnum;
  *(undefined8 *)(buf_00 + -8) = 0x1183d8;
  iVar7 = isscalar(ctx,shader_type,rtype,iVar7);
  if ((iVar7 == 0) && (iVar7 = arg->swizzle, iVar7 != 0xe4)) {
    local_56[lVar11] = '.';
    *(undefined8 *)(buf_00 + -8) = 0x1183f3;
    iVar7 = replicate_swizzle(iVar7);
    local_56[lVar11 + 1] = "xyzw"[arg->swizzle_x];
    if (iVar7 == 0) {
      local_56[lVar11 + 2] = "xyzw"[arg->swizzle_y];
      local_56[lVar11 + 3] = "xyzw"[arg->swizzle_z];
      local_56[lVar11 + 4] = "xyzw"[arg->swizzle_w];
      local_56[lVar11 + 5] = '\0';
      if (!bVar5) {
        *(undefined8 *)(buf_00 + -8) = 0x1184cb;
        __assert_fail("i < sizeof (swizzle_str)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x19de,
                      "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
      goto LAB_0011841c;
    }
    lVar11 = lVar11 + 2;
  }
  local_56[lVar11] = '\0';
LAB_0011841c:
  *(undefined8 *)(buf_00 + -0x10) = 0x40;
  sVar4 = *(size_t *)(buf_00 + -0x10);
  *(char **)(buf_00 + -0x10) = pcStack_50;
  *(char **)(buf_00 + -0x18) = local_56;
  *(char **)(buf_00 + -0x20) = local_70;
  *(ulong **)(buf_00 + -0x28) = &uStack_a8;
  *(undefined4 **)(buf_00 + -0x30) = &local_34;
  *(char **)(buf_00 + -0x38) = local_48;
  *(char **)(buf_00 + -0x40) = local_68;
  *(undefined8 *)(buf_00 + -0x48) = 0x11845c;
  snprintf(buf,sVar4,"%s%s%s%s%s%s%s%s%s%s",local_40,local_60,rel_offset + 0x18);
  return buf;
switchD_00118202_caseD_b:
  if (ctx->profile_supports_nv2 == 0) {
    *(undefined8 *)(buf_00 + -8) = 0x11826d;
    output_line(ctx,"ABS %s, %s;",local_60,buf);
    pcStack_50 = "";
  }
  else {
    local_40 = "-|";
    pcStack_50 = "|";
    if (SVar3 != SRCMOD_ABSNEGATE) {
      local_40 = "|";
    }
  }
  goto LAB_0011838a;
}

Assistant:

static const char *make_ARB1_srcarg_string_in_buf(Context *ctx,
                                                  const SourceArgInfo *arg,
                                                  char *buf, size_t buflen)
{
    // !!! FIXME: this can hit pathological cases where we look like this...
    //
    //    dp3 r1.xyz, t0_bx2, t0_bx2
    //    mad r1.xyz, t0_bias, 1-r1, t0_bx2
    //
    // ...which do a lot of duplicate work in arb1...
    //
    //    SUB scratch0, t0, { 0.5, 0.5, 0.5, 0.5 };
    //    MUL scratch0, scratch0, { 2.0, 2.0, 2.0, 2.0 };
    //    SUB scratch1, t0, { 0.5, 0.5, 0.5, 0.5 };
    //    MUL scratch1, scratch1, { 2.0, 2.0, 2.0, 2.0 };
    //    DP3 r1.xyz, scratch0, scratch1;
    //    SUB scratch0, t0, { 0.5, 0.5, 0.5, 0.5 };
    //    SUB scratch1, { 1.0, 1.0, 1.0, 1.0 }, r1;
    //    SUB scratch2, t0, { 0.5, 0.5, 0.5, 0.5 };
    //    MUL scratch2, scratch2, { 2.0, 2.0, 2.0, 2.0 };
    //    MAD r1.xyz, scratch0, scratch1, scratch2;
    //
    // ...notice that the dp3 calculates the same value into two scratch
    //  registers. This case is easier to handle; just see if multiple
    //  source args are identical, build it up once, and use the same
    //  scratch register for multiple arguments in that opcode.
    //  Even better still, only calculate things once across instructions,
    //  and be smart about letting it linger in a scratch register until we
    //  definitely don't need the calculation anymore. That's harder to
    //  write, though.

    char regnum_str[16] = { '\0' };

    // !!! FIXME: use get_ARB1_varname_in_buf() instead?
    const char *regtype_str = NULL;
    if (!arg->relative)
    {
        regtype_str = get_ARB1_register_string(ctx, arg->regtype,
                                               arg->regnum, regnum_str,
                                               sizeof (regnum_str));
    } // if

    const char *rel_lbracket = "";
    char rel_offset[32] = { '\0' };
    const char *rel_rbracket = "";
    char rel_swizzle[4] = { '\0' };
    const char *rel_regtype_str = "";
    if (arg->relative)
    {
        rel_regtype_str = get_ARB1_varname_in_buf(ctx, arg->relative_regtype,
                                                  arg->relative_regnum,
                                                  (char *) alloca(64), 64);

        rel_swizzle[0] = '.';
        rel_swizzle[1] = swizzle_channels[arg->relative_component];
        rel_swizzle[2] = '\0';

        if (!support_nv2(ctx))
        {
            // The address register in ARB1 only allows the '.x' component, so
            //  we need to load the component we need from a temp vector
            //  register into .x as needed.
            assert(arg->relative_regtype == REG_TYPE_ADDRESS);
            assert(arg->relative_regnum == 0);
            if (ctx->last_address_reg_component != arg->relative_component)
            {
                output_line(ctx, "ARL %s.x, addr%d.%c;", rel_regtype_str,
                            arg->relative_regnum,
                            swizzle_channels[arg->relative_component]);
                ctx->last_address_reg_component = arg->relative_component;
            } // if

            rel_swizzle[1] = 'x';
        } // if

        if (arg->regtype == REG_TYPE_INPUT)
            regtype_str = "vertex.attrib";
        else
        {
            assert(arg->regtype == REG_TYPE_CONST);
            const int arrayidx = arg->relative_array->index;
            const int arraysize = arg->relative_array->count;
            const int offset = arg->regnum - arrayidx;
            assert(offset >= 0);
            regtype_str = get_ARB1_const_array_varname_in_buf(ctx, arrayidx,
                                           arraysize, (char *) alloca(64), 64);
            if (offset != 0)
                snprintf(rel_offset, sizeof (rel_offset), " + %d", offset);
        } // else

        rel_lbracket = "[";
        rel_rbracket = "]";
    } // if

    // This is the source register with everything but swizzle and source mods.
    snprintf(buf, buflen, "%s%s%s%s%s%s%s", regtype_str, regnum_str,
             rel_lbracket, rel_regtype_str, rel_swizzle, rel_offset,
             rel_rbracket);

    // Some of the source mods need to generate instructions to a temp
    //  register, in which case we'll replace the register name.
    const SourceMod mod = arg->src_mod;
    const int inplace = ( (mod == SRCMOD_NONE) || (mod == SRCMOD_NEGATE) ||
                          ((mod == SRCMOD_ABS) && support_nv2(ctx)) );

    if (!inplace)
    {
        const size_t len = 64;
        char *stackbuf = (char *) alloca(len);
        regtype_str = allocate_ARB1_scratch_reg_name(ctx, stackbuf, len);
        regnum_str[0] = '\0'; // move value to scratch register.
        rel_lbracket = "";   // scratch register won't use array.
        rel_rbracket = "";
        rel_offset[0] = '\0';
        rel_swizzle[0] = '\0';
        rel_regtype_str = "";
    } // if

    const char *premod_str = "";
    const char *postmod_str = "";
    switch (mod)
    {
        case SRCMOD_NEGATE:
            premod_str = "-";
            break;

        case SRCMOD_BIASNEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_BIAS:
            output_line(ctx, "SUB %s, %s, { 0.5, 0.5, 0.5, 0.5 };",
                        regtype_str, buf);
            break;

        case SRCMOD_SIGNNEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_SIGN:
            output_line(ctx,
                "MAD %s, %s, { 2.0, 2.0, 2.0, 2.0 }, { -1.0, -1.0, -1.0, -1.0 };",
                regtype_str, buf);
            break;

        case SRCMOD_COMPLEMENT:
            output_line(ctx, "SUB %s, { 1.0, 1.0, 1.0, 1.0 }, %s;",
                        regtype_str, buf);
            break;

        case SRCMOD_X2NEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_X2:
            output_line(ctx, "MUL %s, %s, { 2.0, 2.0, 2.0, 2.0 };",
                        regtype_str, buf);
            break;

        case SRCMOD_DZ:
            fail(ctx, "SRCMOD_DZ currently unsupported in arb1");
            postmod_str = "_dz";
            break;

        case SRCMOD_DW:
            fail(ctx, "SRCMOD_DW currently unsupported in arb1");
            postmod_str = "_dw";
            break;

        case SRCMOD_ABSNEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_ABS:
            if (!support_nv2(ctx))  // GL_NV_vertex_program2_option adds this.
                output_line(ctx, "ABS %s, %s;", regtype_str, buf);
            else
            {
                premod_str = (mod == SRCMOD_ABSNEGATE) ? "-|" : "|";
                postmod_str = "|";
            } // else
            break;

        case SRCMOD_NOT:
            fail(ctx, "SRCMOD_NOT currently unsupported in arb1");
            premod_str = "!";
            break;

        case SRCMOD_NONE:
        case SRCMOD_TOTAL:
             break;  // stop compiler whining.
    } // switch

    char swizzle_str[6];
    size_t i = 0;

    if (support_nv4(ctx))  // vFace must be output as "vFace.x" in nv4.
    {
        if (arg->regtype == REG_TYPE_MISCTYPE)
        {
            if ( ((const MiscTypeType) arg->regnum) == MISCTYPE_TYPE_FACE )
            {
                swizzle_str[i++] = '.';
                swizzle_str[i++] = 'x';
            } // if
        } // if
    } // if

    const int scalar = isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum);
    if (!scalar && !no_swizzle(arg->swizzle))
    {
        swizzle_str[i++] = '.';

        // .xxxx is the same as .x, but .xx is illegal...scalar or full!
        if (replicate_swizzle(arg->swizzle))
            swizzle_str[i++] = swizzle_channels[arg->swizzle_x];
        else
        {
            swizzle_str[i++] = swizzle_channels[arg->swizzle_x];
            swizzle_str[i++] = swizzle_channels[arg->swizzle_y];
            swizzle_str[i++] = swizzle_channels[arg->swizzle_z];
            swizzle_str[i++] = swizzle_channels[arg->swizzle_w];
        } // else
    } // if
    swizzle_str[i] = '\0';
    assert(i < sizeof (swizzle_str));

    snprintf(buf, buflen, "%s%s%s%s%s%s%s%s%s%s", premod_str,
             regtype_str, regnum_str, rel_lbracket,
             rel_regtype_str, rel_swizzle, rel_offset, rel_rbracket,
             swizzle_str, postmod_str);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}